

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_integer<toml::type_config>(location *loc,context<toml::type_config> *ctx)

{
  bool bVar1;
  char_type_conflict cVar2;
  byte bVar3;
  int iVar4;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_RDI;
  source_location src;
  source_location prefix_src;
  char_type_conflict prefix;
  location first;
  context<toml::type_config> *in_stack_00000430;
  location *in_stack_00000438;
  context<toml::type_config> *in_stack_000004c0;
  location *in_stack_000004c8;
  context<toml::type_config> *in_stack_00000730;
  location *in_stack_00000738;
  source_location *in_stack_fffffffffffffc18;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_stack_fffffffffffffc20;
  size_t in_stack_fffffffffffffc28;
  location *in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc38;
  undefined1 in_stack_fffffffffffffc3c;
  undefined1 in_stack_fffffffffffffc3d;
  undefined1 in_stack_fffffffffffffc3e;
  undefined1 in_stack_fffffffffffffc3f;
  allocator<char> *in_stack_fffffffffffffc50;
  char *in_stack_fffffffffffffc58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc60;
  error_info *in_stack_fffffffffffffc78;
  location *in_stack_fffffffffffffc88;
  region *in_stack_fffffffffffffc90;
  region *in_stack_fffffffffffffc98;
  source_location *in_stack_fffffffffffffca0;
  allocator<char> local_309 [225];
  string *in_stack_fffffffffffffdd8;
  source_location *in_stack_fffffffffffffde0;
  string *in_stack_fffffffffffffde8;
  
  location::location((location *)in_RDI,
                     (location *)
                     CONCAT17(in_stack_fffffffffffffc3f,
                              CONCAT16(in_stack_fffffffffffffc3e,
                                       CONCAT15(in_stack_fffffffffffffc3d,
                                                CONCAT14(in_stack_fffffffffffffc3c,
                                                         in_stack_fffffffffffffc38)))));
  bVar1 = location::eof((location *)in_stack_fffffffffffffc20);
  if ((!bVar1) &&
     ((cVar2 = location::current((location *)in_stack_fffffffffffffc18), cVar2 == '+' ||
      (cVar2 = location::current((location *)in_stack_fffffffffffffc18), cVar2 == '-')))) {
    location::advance(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  }
  bVar1 = location::eof((location *)in_stack_fffffffffffffc20);
  if ((!bVar1) && (cVar2 = location::current((location *)in_stack_fffffffffffffc18), cVar2 == '0'))
  {
    location::advance(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    bVar1 = location::eof((location *)in_stack_fffffffffffffc20);
    if (bVar1) {
      location::operator=((location *)in_stack_fffffffffffffc20,
                          (location *)in_stack_fffffffffffffc18);
      parse_dec_integer<toml::type_config>(in_stack_00000738,in_stack_00000730);
      goto LAB_006659dd;
    }
    bVar3 = location::current((location *)in_stack_fffffffffffffc18);
    region::region(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    source_location::source_location(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    region::~region((region *)in_stack_fffffffffffffc20);
    location::operator=((location *)in_stack_fffffffffffffc20,(location *)in_stack_fffffffffffffc18)
    ;
    if (bVar3 == 0x62) {
      parse_bin_integer<toml::type_config>(in_stack_00000438,in_stack_00000430);
      bVar1 = true;
    }
    else if (bVar3 == 0x6f) {
      parse_oct_integer<toml::type_config>(in_stack_00000438,in_stack_00000430);
      bVar1 = true;
    }
    else if (bVar3 == 0x78) {
      parse_hex_integer<toml::type_config>(in_stack_000004c8,in_stack_000004c0);
      bVar1 = true;
    }
    else {
      iVar4 = isdigit((uint)bVar3);
      if (iVar4 == 0) {
        bVar1 = false;
      }
      else {
        region::region(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
        source_location::source_location(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
        region::~region((region *)in_stack_fffffffffffffc20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
        source_location::source_location
                  ((source_location *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
        make_error_info<>(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                          in_stack_fffffffffffffdd8);
        in_stack_fffffffffffffc20 =
             (result<toml::basic_value<toml::type_config>,_toml::error_info> *)(local_309 + 0x79);
        err<toml::error_info>(in_stack_fffffffffffffc78);
        result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                  (in_stack_fffffffffffffc20,(failure_type *)in_stack_fffffffffffffc18);
        failure<toml::error_info>::~failure((failure<toml::error_info> *)0x665827);
        error_info::~error_info((error_info *)in_stack_fffffffffffffc20);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc20);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc57);
        source_location::~source_location((source_location *)in_stack_fffffffffffffc20);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc20);
        std::allocator<char>::~allocator(local_309);
        bVar1 = true;
        source_location::~source_location((source_location *)in_stack_fffffffffffffc20);
      }
    }
    source_location::~source_location((source_location *)in_stack_fffffffffffffc20);
    if (bVar1) goto LAB_006659dd;
  }
  location::operator=((location *)in_stack_fffffffffffffc20,(location *)in_stack_fffffffffffffc18);
  parse_dec_integer<toml::type_config>(in_stack_00000738,in_stack_00000730);
LAB_006659dd:
  location::~location((location *)in_stack_fffffffffffffc20);
  return in_RDI;
}

Assistant:

result<basic_value<TC>, error_info>
parse_integer(location& loc, const context<TC>& ctx)
{
    const auto first = loc;

    if( ! loc.eof() && (loc.current() == '+' || loc.current() == '-'))
    {
        // skip +/- to diagnose +0xDEADBEEF or -0b0011 (invalid).
        // without this, +0xDEAD_BEEF will be parsed as a decimal int and
        // unexpected "xDEAD_BEEF" will appear after integer "+0".
        loc.advance();
    }

    if( ! loc.eof() && loc.current() == '0')
    {
        loc.advance();
        if(loc.eof())
        {
            // `[+-]?0`. parse as an decimal integer.
            loc = first;
            return parse_dec_integer(loc, ctx);
        }

        const auto prefix = loc.current();
        auto prefix_src = source_location(region(loc));

        loc = first;

        if(prefix == 'b') {return parse_bin_integer(loc, ctx);}
        if(prefix == 'o') {return parse_oct_integer(loc, ctx);}
        if(prefix == 'x') {return parse_hex_integer(loc, ctx);}

        if(std::isdigit(prefix))
        {
            auto src = source_location(region(loc));
            return err(make_error_info("toml::parse_integer: "
                "leading zero in an decimal integer is not allowed",
                std::move(src), "leading zero"));
        }
    }

    loc = first;
    return parse_dec_integer(loc, ctx);
}